

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool fast_float::small_mul<(unsigned_short)62>(stackvec<(unsigned_short)62> *vec,limb y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  stackvec<(unsigned_short)62> *psVar5;
  limb *plVar6;
  ulong in_RSI;
  stackvec<(unsigned_short)62> *in_RDI;
  size_t index;
  limb carry;
  __uint128_t z;
  limb in_stack_ffffffffffffffa0;
  stackvec<(unsigned_short)62> *this;
  stackvec<(unsigned_short)62> *local_50;
  ulong local_48;
  ulong local_40;
  stackvec<(unsigned_short)62> *local_38;
  bool local_29;
  undefined1 local_28 [16];
  ulong *local_18;
  ulong local_10;
  ulong local_8;
  
  local_48 = 0;
  local_50 = (stackvec<(unsigned_short)62> *)0x0;
  local_40 = in_RSI;
  local_38 = in_RDI;
  while (this = local_50,
        psVar5 = (stackvec<(unsigned_short)62> *)stackvec<(unsigned_short)62>::len(local_38),
        this < psVar5) {
    plVar6 = stackvec<(unsigned_short)62>::operator[](local_38,(size_t)local_50);
    local_8 = *plVar6;
    local_10 = local_40;
    local_18 = &local_48;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_8;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_40;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_48;
    local_28 = auVar1 * auVar2 + auVar3;
    local_48 = local_28._8_8_;
    in_stack_ffffffffffffffa0 = local_28._0_8_;
    plVar6 = stackvec<(unsigned_short)62>::operator[](local_38,(size_t)local_50);
    *plVar6 = in_stack_ffffffffffffffa0;
    local_50 = (stackvec<(unsigned_short)62> *)((long)local_50->data + 1);
  }
  if ((local_48 == 0) ||
     (bVar4 = stackvec<(unsigned_short)62>::try_push(this,in_stack_ffffffffffffffa0), bVar4)) {
    local_29 = true;
  }
  else {
    local_29 = false;
  }
  return local_29;
}

Assistant:

inline bool small_mul(stackvec<size>& vec, limb y) noexcept {
  limb carry = 0;
  for (size_t index = 0; index < vec.len(); index++) {
    vec[index] = scalar_mul(vec[index], y, carry);
  }
  if (carry != 0) {
    FASTFLOAT_TRY(vec.try_push(carry));
  }
  return true;
}